

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerBase::TryGetFixedProperty<true,false>
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  bool bVar1;
  uint16 uVar2;
  PropertyIndex index_00;
  PropertyId propId;
  int iVar3;
  TypePath *pTVar4;
  undefined4 extraout_var;
  Var aValue;
  byte local_71;
  Var value;
  ObjectSlotAttributes attr;
  ObjectSlotAttributes *attributes;
  PropertyIndex index;
  ScriptContext *requestContext_local;
  FixedPropertyKind propertyType_local;
  Var *pProperty_local;
  PropertyRecord *propertyRecord_local;
  PathTypeHandlerBase *this_local;
  
  bVar1 = FixPropsOnPathTypes();
  if (bVar1) {
    pTVar4 = GetTypePath(this);
    propId = PropertyRecord::GetPropertyId(propertyRecord);
    uVar2 = GetPathLength(this);
    index_00 = TypePath::Lookup(pTVar4,propId,(uint)uVar2);
    if (index_00 == 0xffff) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_71 = 0;
      }
      else {
        local_71 = *(byte *)(CONCAT44(extraout_var,iVar3) + (ulong)index_00);
      }
      if ((local_71 & 0x18) == 0) {
        pTVar4 = GetTypePath(this);
        uVar2 = GetPathLength(this);
        aValue = TypePath::GetSingletonFixedFieldAt(pTVar4,index_00,(uint)uVar2,requestContext);
        if ((aValue == (Var)0x0) ||
           (((bVar1 = DynamicTypeHandler::IsFixedMethodProperty
                                (&this->super_DynamicTypeHandler,propertyType), !bVar1 ||
             (bVar1 = VarIs<Js::JavascriptFunction>(aValue), !bVar1)) &&
            (bVar1 = DynamicTypeHandler::IsFixedDataProperty
                               (&this->super_DynamicTypeHandler,propertyType), !bVar1)))) {
          this_local._7_1_ = false;
        }
        else {
          *pProperty = aValue;
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PathTypeHandlerBase::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, Js::FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        PropertyIndex index = this->GetTypePath()->Lookup(propertyRecord->GetPropertyId(), GetPathLength());
        if (index == Constants::NoSlot)
        {
            AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            return false;
        }

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
        if (attr & (ObjectSlotAttr_Deleted | ObjectSlotAttr_Accessor))
        {
            return false;
        }

        Var value = this->GetTypePath()->GetSingletonFixedFieldAt(index, GetPathLength(), requestContext);
        if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
        {
            *pProperty = value;
            if (markAsUsed)
            {
                this->GetTypePath()->SetIsUsedFixedFieldAt(index, GetPathLength());
            }
            return true;
        }
        else
        {
            return false;
        }
    }